

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter_11.cpp
# Opt level: O0

string * to_lower(string *__return_storage_ptr__,string *line)

{
  bool bVar1;
  int iVar2;
  reference pcVar3;
  char *ch;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  ostringstream oss;
  string *line_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range1);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  ch = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&ch);
    if (!bVar1) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    iVar2 = tolower((int)*pcVar3);
    std::operator<<((ostream *)&__range1,(char)iVar2);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_lower(const std::string& line)
{
	std::ostringstream oss;
	for (auto& ch : line)
	{
		oss << static_cast<char>(std::tolower(ch));
	}
	return oss.str();
}